

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O3

void __thiscall
Assimp::AssbinImporter::ReadBinaryNode
          (AssbinImporter *this,IOStream *stream,aiNode **onode,aiNode *parent)

{
  char *pcVar1;
  _Head_base<0UL,_aiNode_*,_false> _Var2;
  bool bVar3;
  unsigned_short uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ai_uint32 aVar9;
  aiNode *this_00;
  uint *puVar10;
  aiNode **ppaVar11;
  aiMetadata *paVar12;
  aiString *paVar13;
  aiMetadataEntry *__s;
  double dVar14;
  aiString *paVar15;
  runtime_error *this_01;
  ulong __n;
  uint i;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  float fVar19;
  undefined4 extraout_XMM0_Db;
  unique_ptr<aiNode,_std::default_delete<aiNode>_> node;
  _Head_base<0UL,_aiNode_*,_false> local_470;
  undefined8 local_468;
  aiNode **local_450;
  float local_448;
  float local_438;
  undefined4 uStack_434;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  
  local_450 = onode;
  uVar5 = Read<unsigned_int>(stream);
  if (uVar5 != 0x123c) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    _local_438 = (undefined1 *)&stack0xfffffffffffffbd8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffffbc8,"Magic chunk identifiers are wrong!","");
    std::runtime_error::runtime_error(this_01,(string *)&stack0xfffffffffffffbc8);
    *(undefined ***)this_01 = &PTR__runtime_error_0080bf48;
    __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  Read<unsigned_int>(stream);
  this_00 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_00);
  local_470._M_head_impl = this_00;
  Read<aiString>((aiString *)&stack0xfffffffffffffbc8,stream);
  _Var2._M_head_impl = local_470._M_head_impl;
  if (local_470._M_head_impl != (aiNode *)&stack0xfffffffffffffbc8) {
    uVar16 = (ulong)_local_438 & 0xffffffff;
    ((local_470._M_head_impl)->mName).length = (ai_uint32)local_438;
    memcpy(((local_470._M_head_impl)->mName).data,&stack0xfffffffffffffbcc,uVar16);
    ((_Var2._M_head_impl)->mName).data[uVar16] = '\0';
  }
  Read<aiMatrix4x4t<float>>((aiMatrix4x4 *)&stack0xfffffffffffffbc8,stream);
  *(undefined8 *)&((local_470._M_head_impl)->mTransformation).d1 = local_408;
  *(undefined8 *)&((local_470._M_head_impl)->mTransformation).d3 = uStack_400;
  *(undefined8 *)&((local_470._M_head_impl)->mTransformation).c1 = local_418;
  *(undefined8 *)&((local_470._M_head_impl)->mTransformation).c3 = uStack_410;
  *(undefined8 *)&((local_470._M_head_impl)->mTransformation).b1 = local_428;
  *(undefined8 *)&((local_470._M_head_impl)->mTransformation).b3 = uStack_420;
  ((local_470._M_head_impl)->mTransformation).a1 = local_438;
  ((local_470._M_head_impl)->mTransformation).a2 = (float)uStack_434;
  *(undefined8 *)&((local_470._M_head_impl)->mTransformation).a3 = uStack_430;
  uVar5 = Read<unsigned_int>(stream);
  uVar6 = Read<unsigned_int>(stream);
  uVar7 = Read<unsigned_int>(stream);
  if (parent != (aiNode *)0x0) {
    (local_470._M_head_impl)->mParent = parent;
  }
  if (uVar6 != 0) {
    puVar10 = (uint *)operator_new__((ulong)uVar6 * 4);
    (local_470._M_head_impl)->mMeshes = puVar10;
    uVar16 = 0;
    do {
      uVar8 = Read<unsigned_int>(stream);
      (local_470._M_head_impl)->mMeshes[uVar16] = uVar8;
      (local_470._M_head_impl)->mNumMeshes = (local_470._M_head_impl)->mNumMeshes + 1;
      uVar16 = uVar16 + 1;
    } while (uVar6 != uVar16);
  }
  if (uVar5 != 0) {
    ppaVar11 = (aiNode **)operator_new__((ulong)uVar5 << 3);
    (local_470._M_head_impl)->mChildren = ppaVar11;
    uVar16 = 0;
    do {
      ReadBinaryNode(this,stream,(aiNode **)((long)(local_470._M_head_impl)->mChildren + uVar16),
                     local_470._M_head_impl);
      (local_470._M_head_impl)->mNumChildren = (local_470._M_head_impl)->mNumChildren + 1;
      uVar16 = uVar16 + 8;
    } while ((ulong)uVar5 << 3 != uVar16);
  }
  if (uVar7 != 0) {
    paVar12 = (aiMetadata *)operator_new(0x18);
    paVar12->mNumProperties = uVar7;
    uVar16 = (ulong)uVar7;
    paVar13 = (aiString *)operator_new__(uVar16 * 0x404);
    paVar15 = paVar13;
    local_468 = paVar12;
    do {
      paVar15->length = 0;
      paVar15->data[0] = '\0';
      memset(paVar15->data + 1,0x1b,0x3ff);
      paVar12 = local_468;
      paVar15 = paVar15 + 1;
    } while (paVar15 != paVar13 + uVar16);
    local_468->mKeys = paVar13;
    __s = (aiMetadataEntry *)operator_new__(uVar16 << 4);
    uVar18 = 0;
    memset(__s,0,uVar16 << 4);
    paVar12->mValues = __s;
    (local_470._M_head_impl)->mMetaData = paVar12;
    lVar17 = 8;
    do {
      Read<aiString>((aiString *)&stack0xfffffffffffffbc8,stream);
      paVar13 = (local_470._M_head_impl)->mMetaData->mKeys;
      paVar15 = (aiString *)(paVar13->data + (uVar18 - 4));
      if (paVar15 != (aiString *)&stack0xfffffffffffffbc8) {
        __n = (ulong)_local_438 & 0xffffffff;
        pcVar1 = paVar13->data + (uVar18 - 4);
        *(float *)pcVar1 = local_438;
        memcpy(pcVar1 + 4,&stack0xfffffffffffffbcc,__n);
        paVar15->data[__n] = '\0';
      }
      uVar4 = Read<unsigned_short>(stream);
      *(uint *)((long)(local_470._M_head_impl)->mMetaData->mValues + lVar17 + -8) = (uint)uVar4;
      switch(*(undefined4 *)((long)(local_470._M_head_impl)->mMetaData->mValues + lVar17 + -8)) {
      case 0:
        paVar15 = (aiString *)operator_new(1);
        bVar3 = Read<bool>(stream);
        *(bool *)&paVar15->length = bVar3;
        break;
      case 1:
        paVar15 = (aiString *)operator_new(4);
        aVar9 = Read<int>(stream);
        paVar15->length = aVar9;
        break;
      case 2:
        paVar15 = (aiString *)operator_new(8);
        dVar14 = (double)Read<unsigned_long>(stream);
        *(double *)paVar15 = dVar14;
        break;
      case 3:
        paVar15 = (aiString *)operator_new(4);
        fVar19 = Read<float>(stream);
        paVar15->length = (ai_uint32)fVar19;
        break;
      case 4:
        paVar15 = (aiString *)operator_new(8);
        dVar14 = Read<double>(stream);
        *(double *)paVar15 = dVar14;
        break;
      case 5:
        paVar15 = (aiString *)operator_new(0x404);
        Read<aiString>(paVar15,stream);
        break;
      case 6:
        paVar15 = (aiString *)operator_new(0xc);
        fVar19 = Read<float>(stream);
        local_468 = (aiMetadata *)CONCAT44(extraout_XMM0_Db,fVar19);
        local_448 = Read<float>(stream);
        fVar19 = Read<float>(stream);
        *(ulong *)paVar15 = CONCAT44(local_448,(undefined4)local_468);
        *(float *)(paVar15->data + 4) = fVar19;
        break;
      default:
        paVar15 = (aiString *)0x0;
      }
      *(aiString **)((long)&(local_470._M_head_impl)->mMetaData->mValues->mType + lVar17) = paVar15;
      uVar18 = uVar18 + 0x404;
      lVar17 = lVar17 + 0x10;
    } while (uVar16 * 0x404 != uVar18);
  }
  _Var2._M_head_impl = local_470._M_head_impl;
  local_470._M_head_impl = (aiNode *)0x0;
  *local_450 = _Var2._M_head_impl;
  std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::~unique_ptr
            ((unique_ptr<aiNode,_std::default_delete<aiNode>_> *)&local_470);
  return;
}

Assistant:

void AssbinImporter::ReadBinaryNode( IOStream * stream, aiNode** onode, aiNode* parent ) {
    if(Read<uint32_t>(stream) != ASSBIN_CHUNK_AINODE)
        throw DeadlyImportError("Magic chunk identifiers are wrong!");
    /*uint32_t size =*/ Read<uint32_t>(stream);

    std::unique_ptr<aiNode> node(new aiNode());

    node->mName = Read<aiString>(stream);
    node->mTransformation = Read<aiMatrix4x4>(stream);
    unsigned numChildren = Read<unsigned int>(stream);
    unsigned numMeshes = Read<unsigned int>(stream);
	unsigned int nb_metadata = Read<unsigned int>(stream);

    if(parent) {
        node->mParent = parent;
    }

    if (numMeshes)
    {
        node->mMeshes = new unsigned int[numMeshes];
        for (unsigned int i = 0; i < numMeshes; ++i) {
            node->mMeshes[i] = Read<unsigned int>(stream);
            node->mNumMeshes++;
        }
    }

    if (numChildren) {
        node->mChildren = new aiNode*[numChildren];
        for (unsigned int i = 0; i < numChildren; ++i) {
            ReadBinaryNode( stream, &node->mChildren[i], node.get() );
            node->mNumChildren++;
        }
    }

    if ( nb_metadata > 0 ) {
        node->mMetaData = aiMetadata::Alloc(nb_metadata);
        for (unsigned int i = 0; i < nb_metadata; ++i) {
            node->mMetaData->mKeys[i] = Read<aiString>(stream);
            node->mMetaData->mValues[i].mType = (aiMetadataType) Read<uint16_t>(stream);
            void* data = nullptr;

            switch (node->mMetaData->mValues[i].mType) {
                case AI_BOOL:
                    data = new bool(Read<bool>(stream));
                    break;
                case AI_INT32:
                    data = new int32_t(Read<int32_t>(stream));
                    break;
                case AI_UINT64:
                    data = new uint64_t(Read<uint64_t>(stream));
                    break;
                case AI_FLOAT:
                    data = new float(Read<float>(stream));
                    break;
                case AI_DOUBLE:
                    data = new double(Read<double>(stream));
                    break;
                case AI_AISTRING:
                    data = new aiString(Read<aiString>(stream));
                    break;
                case AI_AIVECTOR3D:
                    data = new aiVector3D(Read<aiVector3D>(stream));
                    break;
#ifndef SWIG
                case FORCE_32BIT:
#endif // SWIG
                default:
                    break;
            }

			node->mMetaData->mValues[i].mData = data;
		}
	}
    *onode = node.release();
}